

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

string * __thiscall
(anonymous_namespace)::WriteJson_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Value *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Value *pVVar2;
  string *extraout_RAX;
  Value *in_RCX;
  StreamWriterBuilder writer;
  String local_90;
  Value local_70;
  StreamWriterBuilder local_48;
  
  Json::StreamWriterBuilder::StreamWriterBuilder(&local_48);
  Json::Value::Value(&local_70,"  ");
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"indentation","");
  pVVar2 = Json::StreamWriterBuilder::operator[](&local_48,&local_90);
  Json::Value::operator=(pVVar2,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  Json::Value::~Value(&local_70);
  Json::Value::Value(&local_70,"None");
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"commentStyle","");
  pVVar2 = Json::StreamWriterBuilder::operator[](&local_48,&local_90);
  Json::Value::operator=(pVVar2,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  Json::Value::~Value(&local_70);
  Json::writeString_abi_cxx11_(__return_storage_ptr__,(Json *)&local_48,(Factory *)this,in_RCX);
  Json::StreamWriterBuilder::~StreamWriterBuilder(&local_48);
  return extraout_RAX;
}

Assistant:

std::string WriteJson(const Json::Value& value)
{
  Json::StreamWriterBuilder writer;
  writer["indentation"] = "  ";
  writer["commentStyle"] = "None";
  return Json::writeString(writer, value);
}